

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

EdgeIdx __thiscall Escape::CGraph::getEdge(CGraph *this,VertexIdx v1,VertexIdx v2)

{
  long local_30;
  EdgeIdx i;
  VertexIdx v2_local;
  VertexIdx v1_local;
  CGraph *this_local;
  
  if (v1 < this->nVertices) {
    for (local_30 = this->offsets[v1]; local_30 < this->offsets[v1 + 1]; local_30 = local_30 + 1) {
      if (this->nbors[local_30] == v2) {
        return local_30;
      }
    }
  }
  return -1;
}

Assistant:

EdgeIdx CGraph::getEdge(VertexIdx v1, VertexIdx v2) const {
    if (v1 >= nVertices)
        return -1;
    for (EdgeIdx i = offsets[v1]; i < offsets[v1 + 1]; ++i)
        if (nbors[i] == v2)
            return i;
    return -1;
}